

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

string * __thiscall
pstore::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  char *pcVar1;
  allocator local_29;
  char *local_28;
  char *result;
  error_category *peStack_18;
  int error_local;
  error_category *this_local;
  
  local_28 = "unknown pstore::category error";
  switch(error) {
  case 0:
    local_28 = "no error";
    break;
  case 1:
    local_28 = "an attempt to create a transaction when the database is read-only";
    break;
  case 2:
    local_28 = "unknown revision";
    break;
  case 3:
    local_28 = "header corrupt";
    break;
  case 4:
    local_28 = "header version mismatch";
    break;
  case 5:
    local_28 = "footer corrupt";
    break;
  case 6:
    local_28 = "index corrupt";
    break;
  case 7:
    local_28 = "an address was not correctly aligned for its type";
    break;
  case 8:
    local_28 = "index not latest revision";
    break;
  case 9:
    local_28 = "could not discover the path of the calling process image";
    break;
  case 10:
    local_28 = "an attempt to read or write from a store which is not open";
    break;
  case 0xb:
    local_28 = "an attempt was made to allocate data without an open transaction";
    break;
  case 0xc:
    local_28 = "an attempt to access an address outside of the allocated storage";
    break;
  case 0xd:
    local_28 = "there was an attempt to write to read-only storage";
    break;
  case 0xe:
    local_28 = "did not read number of bytes requested";
    break;
  case 0xf:
    local_28 = "UUID parse error";
    break;
  case 0x10:
    local_28 = "bad message part number";
    break;
  case 0x11:
    local_28 = "unable to open named pipe";
    break;
  case 0x12:
    local_28 = "pipe write timeout";
    break;
  case 0x13:
    local_28 = "write failed";
  }
  pcVar1 = local_28;
  result._4_4_ = error;
  peStack_18 = this;
  this_local = (error_category *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string pstore::error_category::message (int const error) const {
    static_assert (std::is_same<std::underlying_type<error_code>::type,
                                std::remove_cv<decltype (error)>::type>::value,
                   "base type of pstore::error_code must be int to permit safe static cast");

    auto const * result = "unknown pstore::category error";
    switch (static_cast<error_code> (error)) {
    case error_code::none: result = "no error"; break;
    case error_code::transaction_on_read_only_database:
        result = "an attempt to create a transaction when the database is read-only";
        break;
    case error_code::unknown_revision: result = "unknown revision"; break;
    case error_code::header_corrupt: result = "header corrupt"; break;
    case error_code::header_version_mismatch: result = "header version mismatch"; break;
    case error_code::footer_corrupt: result = "footer corrupt"; break;
    case error_code::index_corrupt: result = "index corrupt"; break;
    case error_code::bad_alignment:
        result = "an address was not correctly aligned for its type";
        break;
    case error_code::index_not_latest_revision: result = "index not latest revision"; break;
    case error_code::unknown_process_path:
        result = "could not discover the path of the calling process image";
        break;
    case error_code::store_closed:
        result = "an attempt to read or write from a store which is not open";
        break;
    case error_code::cannot_allocate_after_commit:
        result = "an attempt was made to allocate data without an open transaction";
        break;
    case error_code::bad_address:
        result = "an attempt to access an address outside of the allocated storage";
        break;
    case error_code::read_only_address:
        result = "there was an attempt to write to read-only storage";
        break;
    case error_code::did_not_read_number_of_bytes_requested:
        result = "did not read number of bytes requested";
        break;
    case error_code::uuid_parse_error: result = "UUID parse error"; break;
    case error_code::bad_message_part_number: result = "bad message part number"; break;
    case error_code::unable_to_open_named_pipe: result = "unable to open named pipe"; break;
    case error_code::pipe_write_timeout: result = "pipe write timeout"; break;
    case error_code::write_failed: result = "write failed"; break;
    }
    return result;
}